

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

SyntaxTree * __thiscall DL::Parser::gr_tr_unit(Parser *this)

{
  bool bVar1;
  SyntaxTree *pSVar2;
  Token local_70;
  StatementNode *local_48;
  Token local_40;
  SyntaxTree *local_18;
  SyntaxTree *unit;
  Parser *this_local;
  
  unit = (SyntaxTree *)this;
  pSVar2 = (SyntaxTree *)operator_new(0x18);
  SyntaxTree::SyntaxTree(pSVar2);
  local_18 = pSVar2;
  while( true ) {
    bVar1 = lookahead(this,T_OpenParanthese);
    if (!bVar1) break;
    match(&local_40,this,T_OpenParanthese);
    Token::~Token(&local_40);
    pSVar2 = local_18;
    local_48 = gr_statement(this);
    std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>::push_back
              (&pSVar2->Nodes,&local_48);
    match(&local_70,this,T_CloseParanthese);
    Token::~Token(&local_70);
  }
  return local_18;
}

Assistant:

SyntaxTree* Parser::gr_tr_unit()
{
	SyntaxTree* unit = new SyntaxTree;
	while (lookahead(T_OpenParanthese)) {
		match(T_OpenParanthese);
		unit->Nodes.push_back(gr_statement());
		match(T_CloseParanthese);
	};
	return unit;
}